

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LBundleColorMap_C(uint8_t *row,int width,int xbits,uint32_t *dst)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (xbits < 1) {
    if (0 < width) {
      uVar2 = 0;
      do {
        dst[uVar2] = (uint)row[uVar2] << 8 | 0xff000000;
        uVar2 = uVar2 + 1;
      } while ((uint)width != uVar2);
    }
  }
  else {
    bVar1 = (byte)xbits;
    if (0 < width) {
      uVar2 = 0;
      uVar3 = 0xff000000;
      do {
        uVar4 = (uint)uVar2 & ~(-1 << (bVar1 & 0x1f));
        if (uVar4 == 0) {
          uVar3 = 0xff000000;
        }
        uVar3 = uVar3 | (uint)row[uVar2] << ((char)(uVar4 << (3 - bVar1 & 0x1f)) + 8U & 0x1f);
        dst[(uint)uVar2 >> (bVar1 & 0x1f)] = uVar3;
        uVar2 = uVar2 + 1;
      } while ((uint)width != uVar2);
      return;
    }
  }
  return;
}

Assistant:

void VP8LBundleColorMap_C(const uint8_t* WEBP_RESTRICT const row,
                          int width, int xbits, uint32_t* WEBP_RESTRICT dst) {
  int x;
  if (xbits > 0) {
    const int bit_depth = 1 << (3 - xbits);
    const int mask = (1 << xbits) - 1;
    uint32_t code = 0xff000000;
    for (x = 0; x < width; ++x) {
      const int xsub = x & mask;
      if (xsub == 0) {
        code = 0xff000000;
      }
      code |= row[x] << (8 + bit_depth * xsub);
      dst[x >> xbits] = code;
    }
  } else {
    for (x = 0; x < width; ++x) dst[x] = 0xff000000 | (row[x] << 8);
  }
}